

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O3

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  pointer pMVar9;
  void *in_R8;
  int _h;
  void *__src;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar10;
  void *__dest;
  bool bVar11;
  Mat m;
  Mat local_318;
  Mat local_2c8;
  ulong local_280;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_278;
  Mat m_2;
  Mat m_1;
  Mat m_4;
  Mat m_3;
  Mat local_150;
  Mat local_108;
  Mat m_6;
  Mat m_5;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_280 = (ulong)(uint)bottom_blob->h;
  iVar8 = this->direction;
  local_2c8.cstep = 0;
  local_2c8.data = (void *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize._0_4_ = 0;
  local_2c8.elemsize._4_4_ = 0;
  local_2c8.elempack = 0;
  local_2c8.allocator = (Allocator *)0x0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize._0_4_ = 0;
  local_318.elemsize._4_4_ = 0;
  local_318.elempack = 0;
  local_318.allocator = (Allocator *)0x0;
  local_318.dims = 0;
  local_318.w = 0;
  local_318.h = 0;
  local_318.d = 0;
  local_318.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  local_278 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    pvVar10 = local_278;
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_2c8.allocator == (Allocator *)0x0) {
          if (local_2c8.data != (void *)0x0) {
            free(local_2c8.data);
          }
        }
        else {
          (*(local_2c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_2c8.data = m.data;
    local_2c8.refcount._0_4_ = m.refcount._0_4_;
    local_2c8.refcount._4_4_ = m.refcount._4_4_;
    local_2c8.elemsize._0_4_ = (undefined4)m.elemsize;
    local_2c8.elemsize._4_4_ = m.elemsize._4_4_;
    local_2c8.elempack = m.elempack;
    local_2c8.allocator = m.allocator;
    local_2c8.dims = m.dims;
    local_2c8.w = m.w;
    local_2c8.h = m.h;
    uVar2._0_4_ = m.d;
    uVar2._4_4_ = m.c;
    local_2c8.d = m.d;
    local_2c8.c = m.c;
    local_2c8.cstep = m.cstep;
    sVar6 = m.cstep;
    uVar3 = uVar2;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      uVar3 = local_2c8._52_8_;
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            local_2c8._52_8_ = uVar2;
            free(m.data);
            uVar3 = local_2c8._52_8_;
          }
        }
        else {
          local_2c8._52_8_ = uVar2;
          (*(m.allocator)->_vptr_Allocator[3])();
          uVar3 = local_2c8._52_8_;
        }
      }
    }
    local_2c8._52_8_ = uVar3;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar6,
               in_R8);
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_318.allocator == (Allocator *)0x0) {
          if (local_318.data != (void *)0x0) {
            free(local_318.data);
          }
        }
        else {
          (*(local_318.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_318.data = m.data;
    local_318.refcount._0_4_ = m.refcount._0_4_;
    local_318.refcount._4_4_ = m.refcount._4_4_;
    local_318.elemsize._0_4_ = (undefined4)m.elemsize;
    local_318.elemsize._4_4_ = m.elemsize._4_4_;
    local_318.elempack = m.elempack;
    local_318.allocator = m.allocator;
    local_318.dims = m.dims;
    local_318.w = m.w;
    local_318.h = m.h;
    local_318.d = m.d;
    local_318.c = m.c;
    local_318.cstep = m.cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    _h = (iVar8 == 2) + 1;
    Mat::create(&local_2c8,this->num_output,_h,4,_allocator);
    iVar5 = -100;
    if ((local_2c8.data == (void *)0x0) || (local_2c8.cstep * (long)local_2c8.c == 0))
    goto LAB_0038d5ed;
    uVar4 = (int)local_2c8.cstep * local_2c8.c;
    if (0 < (int)uVar4) {
      memset(local_2c8.data,0,(ulong)uVar4 << 2);
    }
    Mat::create(&local_318,this->num_output,_h,4,_allocator);
    pvVar10 = local_278;
    if ((local_318.data == (void *)0x0) || (local_318.cstep * (long)local_318.c == 0))
    goto LAB_0038d5ed;
    uVar4 = (int)local_318.cstep * local_318.c;
    if (0 < (int)uVar4) {
      memset(local_318.data,0,(ulong)uVar4 << 2);
    }
  }
  this_00 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar8 == 2),(int)local_280,4,opt->blob_allocator);
  iVar5 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    uVar4 = this->direction;
    if (uVar4 < 2) {
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.data = (this->weight_xc_data).data;
      uVar7 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar7;
      m.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m.c = (this->weight_xc_data).d;
      m.d = 1;
      iVar8 = (this->weight_xc_data).dims;
      m.dims = iVar8 + -1;
      m.cstep = (uVar7 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar8 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.data = (this->bias_c_data).data;
      uVar7 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar7;
      m_1.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m_1.c = (this->bias_c_data).d;
      m_1.d = 1;
      iVar8 = (this->bias_c_data).dims;
      m_1.dims = iVar8 + -1;
      m_1.cstep = (uVar7 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar8 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = (this->weight_hc_data).d;
      m_2.data = (this->weight_hc_data).data;
      m_2.elemsize = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar6 = (long)m_2.h * (long)m_2.w;
      iVar8 = (this->weight_hc_data).dims;
      m_2.dims = iVar8 + -1;
      m_2.cstep = (m_2.elemsize * sVar6 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar8 == 4) {
        m_2.cstep = sVar6;
      }
      iVar5 = lstm(bottom_blob,this_00,uVar4,&m,&m_1,&m_2,&local_2c8,&local_318,
                   (Option *)opt->workspace_allocator);
      if (iVar5 != 0) goto LAB_0038d5ed;
      uVar4 = this->direction;
    }
    if (uVar4 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      iVar8 = (int)local_280;
      Mat::create(&m,this->num_output,iVar8,4,opt->workspace_allocator);
      iVar5 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar11 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,this->num_output,iVar8,4,opt->workspace_allocator);
        iVar5 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar11 = false;
        }
        else {
          m_2.cstep = (size_t)local_2c8.w;
          m_2.elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
          m_2.data = local_2c8.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_2c8.elempack;
          m_2.allocator = local_2c8.allocator;
          m_2.dims = 2;
          m_2.w = local_2c8.w;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          local_108.cstep = (size_t)local_318.w;
          local_108.elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
          local_108.data = local_318.data;
          local_108.refcount = (int *)0x0;
          local_108.elempack = local_318.elempack;
          local_108.allocator = local_318.allocator;
          local_108.dims = 2;
          local_108.w = local_318.w;
          local_108.h = 1;
          local_108.d = 1;
          local_108.c = 1;
          local_150.w = (this->weight_xc_data).w;
          local_150.h = (this->weight_xc_data).h;
          local_150.c = (this->weight_xc_data).d;
          local_150.data = (this->weight_xc_data).data;
          local_150.elemsize = (this->weight_xc_data).elemsize;
          local_150.elempack = (this->weight_xc_data).elempack;
          local_150.allocator = (this->weight_xc_data).allocator;
          local_150.refcount = (int *)0x0;
          local_150.d = 1;
          uVar7 = (long)local_150.h * (long)local_150.w;
          iVar8 = (this->weight_xc_data).dims;
          local_150.dims = iVar8 + -1;
          local_150.cstep =
               (local_150.elemsize * uVar7 + 0xf & 0xfffffffffffffff0) / local_150.elemsize;
          if (iVar8 == 4) {
            local_150.cstep = uVar7;
          }
          m_3.w = (this->bias_c_data).w;
          m_3.h = (this->bias_c_data).h;
          m_3.c = (this->bias_c_data).d;
          m_3.data = (this->bias_c_data).data;
          m_3.elemsize = (this->bias_c_data).elemsize;
          m_3.elempack = (this->bias_c_data).elempack;
          m_3.allocator = (this->bias_c_data).allocator;
          m_3.refcount = (int *)0x0;
          m_3.d = 1;
          sVar6 = (long)m_3.h * (long)m_3.w;
          iVar8 = (this->bias_c_data).dims;
          m_3.dims = iVar8 + -1;
          m_3.cstep = (m_3.elemsize * sVar6 + 0xf & 0xfffffffffffffff0) / m_3.elemsize;
          if (iVar8 == 4) {
            m_3.cstep = sVar6;
          }
          m_4.w = (this->weight_hc_data).w;
          m_4.h = (this->weight_hc_data).h;
          m_4.c = (this->weight_hc_data).d;
          m_4.data = (this->weight_hc_data).data;
          m_4.elemsize = (this->weight_hc_data).elemsize;
          m_4.elempack = (this->weight_hc_data).elempack;
          m_4.allocator = (this->weight_hc_data).allocator;
          m_4.refcount = (int *)0x0;
          m_4.d = 1;
          iVar8 = (this->weight_hc_data).dims;
          m_4.dims = iVar8 + -1;
          m_4.cstep = (m_4.elemsize * (long)m_4.h * (long)m_4.w + 0xf & 0xfffffffffffffff0) /
                      m_4.elemsize;
          if (iVar8 == 4) {
            m_4.cstep = (long)m_4.h * (long)m_4.w;
          }
          iVar5 = lstm(bottom_blob,&m,0,&local_150,&m_3,&m_4,&m_2,&local_108,
                       (Option *)opt->workspace_allocator);
          uVar7 = local_280;
          if (iVar5 == 0) {
            local_150.cstep = (size_t)local_2c8.w;
            local_150.elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
            local_150.data = (void *)(local_150.elemsize * local_150.cstep + (long)local_2c8.data);
            local_150.refcount = (int *)0x0;
            local_150.elempack = local_2c8.elempack;
            local_150.allocator = local_2c8.allocator;
            local_150.dims = 2;
            local_150.w = local_2c8.w;
            local_150.h = 1;
            local_150.d = 1;
            local_150.c = 1;
            m_3.cstep = (size_t)local_318.w;
            m_3.elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
            m_3.data = (void *)(m_3.elemsize * m_3.cstep + (long)local_318.data);
            m_3.refcount = (int *)0x0;
            m_3.elempack = local_318.elempack;
            m_3.allocator = local_318.allocator;
            m_3.dims = 2;
            m_3.w = local_318.w;
            m_3.h = 1;
            m_3.d = 1;
            m_3.c = 1;
            m_4.w = (this->weight_xc_data).w;
            m_4.h = (this->weight_xc_data).h;
            m_4.c = (this->weight_xc_data).d;
            m_4.elemsize = (this->weight_xc_data).elemsize;
            m_4.data = (void *)((this->weight_xc_data).cstep * m_4.elemsize +
                               (long)(this->weight_xc_data).data);
            m_4.elempack = (this->weight_xc_data).elempack;
            m_4.allocator = (this->weight_xc_data).allocator;
            m_4.refcount = (int *)0x0;
            m_4.d = 1;
            iVar8 = (this->weight_xc_data).dims;
            m_4.dims = iVar8 + -1;
            m_4.cstep = (m_4.elemsize * (long)m_4.h * (long)m_4.w + 0xf & 0xfffffffffffffff0) /
                        m_4.elemsize;
            if (iVar8 == 4) {
              m_4.cstep = (long)m_4.h * (long)m_4.w;
            }
            m_5.w = (this->bias_c_data).w;
            m_5.h = (this->bias_c_data).h;
            m_5.c = (this->bias_c_data).d;
            m_5.elemsize = (this->bias_c_data).elemsize;
            m_5.data = (void *)((this->bias_c_data).cstep * m_5.elemsize +
                               (long)(this->bias_c_data).data);
            m_5.elempack = (this->bias_c_data).elempack;
            m_5.allocator = (this->bias_c_data).allocator;
            m_5.refcount = (int *)0x0;
            m_5.d = 1;
            iVar8 = (this->bias_c_data).dims;
            m_5.dims = iVar8 + -1;
            m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                        m_5.elemsize;
            if (iVar8 == 4) {
              m_5.cstep = (long)m_5.h * (long)m_5.w;
            }
            m_6.w = (this->weight_hc_data).w;
            m_6.h = (this->weight_hc_data).h;
            m_6.c = (this->weight_hc_data).d;
            m_6.elemsize = (this->weight_hc_data).elemsize;
            m_6.data = (void *)((this->weight_hc_data).cstep * m_6.elemsize +
                               (long)(this->weight_hc_data).data);
            m_6.elempack = (this->weight_hc_data).elempack;
            m_6.allocator = (this->weight_hc_data).allocator;
            m_6.refcount = (int *)0x0;
            m_6.d = 1;
            iVar8 = (this->weight_hc_data).dims;
            m_6.dims = iVar8 + -1;
            m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                        m_6.elemsize;
            if (iVar8 == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
            iVar5 = lstm(bottom_blob,&m_1,1,&m_4,&m_5,&m_6,&local_150,&m_3,
                         (Option *)opt->workspace_allocator);
            bVar11 = iVar5 == 0;
            if (bVar11) {
              if ((int)uVar7 < 1) {
                iVar5 = 0;
              }
              else {
                iVar5 = 0;
                uVar7 = 0;
                do {
                  __src = (void *)((long)m_1.w * uVar7 *
                                   CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                  (long)m_1.data);
                  __dest = (void *)((long)this_00->w * uVar7 * this_00->elemsize +
                                   (long)this_00->data);
                  memcpy(__dest,(void *)((long)m.w * uVar7 *
                                         CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                        (long)m.data),(long)this->num_output << 2);
                  memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                         (long)this->num_output << 2);
                  uVar7 = uVar7 + 1;
                  pvVar10 = local_278;
                } while (local_280 != uVar7);
              }
            }
            if (local_108.refcount != (int *)0x0) {
              LOCK();
              *local_108.refcount = *local_108.refcount + -1;
              UNLOCK();
              if (*local_108.refcount == 0) {
                if (local_108.allocator == (Allocator *)0x0) {
                  if (local_108.data != (void *)0x0) {
                    free(local_108.data);
                  }
                }
                else {
                  (*(local_108.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar11 = false;
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar1 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar11) goto LAB_0038d5ed;
    }
    pMVar9 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = 0;
    if ((long)(pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar9 == 0xd8) {
      if (pMVar9 + 1 != &local_2c8) {
        piVar1 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = pMVar9[1].refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (pMVar9[1].allocator == (Allocator *)0x0) {
              if (pMVar9[1].data != (void *)0x0) {
                free(pMVar9[1].data);
              }
            }
            else {
              (*(pMVar9[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar9[1].data = local_2c8.data;
        pMVar9[1].refcount = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
        pMVar9[1].elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
        pMVar9[1].elempack = local_2c8.elempack;
        pMVar9[1].allocator = local_2c8.allocator;
        pMVar9[1].dims = local_2c8.dims;
        pMVar9[1].w = local_2c8.w;
        pMVar9[1].h = local_2c8.h;
        pMVar9[1].d = local_2c8.d;
        pMVar9[1].c = local_2c8.c;
        pMVar9[1].cstep = local_2c8.cstep;
        pMVar9 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar5 = 0;
      if (pMVar9 + 2 != &local_318) {
        piVar1 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = pMVar9[2].refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (pMVar9[2].allocator == (Allocator *)0x0) {
              if (pMVar9[2].data != (void *)0x0) {
                free(pMVar9[2].data);
              }
            }
            else {
              (*(pMVar9[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar9[2].data = local_318.data;
        pMVar9[2].refcount = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
        pMVar9[2].elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
        pMVar9[2].elempack = local_318.elempack;
        pMVar9[2].allocator = local_318.allocator;
        pMVar9[2].dims = local_318.dims;
        pMVar9[2].w = local_318.w;
        pMVar9[2].h = local_318.h;
        pMVar9[2].d = local_318.d;
        pMVar9[2].c = local_318.c;
        pMVar9[2].cstep = local_318.cstep;
      }
    }
  }
LAB_0038d5ed:
  piVar1 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_318.allocator == (Allocator *)0x0) {
        if (local_318.data != (void *)0x0) {
          free(local_318.data);
        }
      }
      else {
        (*(local_318.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if (local_2c8.data != (void *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}